

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

double gl4cts::Math::roundEven<double>(double t)

{
  double dVar1;
  double dVar2;
  
  dVar1 = floor(t);
  dVar1 = t - dVar1;
  dVar2 = t - dVar1;
  if ((0.5 < dVar1) || (((dVar1 == 0.5 && (!NAN(dVar1))) && (((int)dVar2 & 1U) != 0)))) {
    dVar2 = dVar2 + 1.0;
  }
  return dVar2;
}

Assistant:

static T roundEven(T t)
{
	T frac = fract(t);
	T res  = t - frac;

	if (((T)0.5) < frac)
	{
		res += ((T)1.0);
	}
	else if ((((T)0.5) == frac) && (0 != ((int)res) % 2))
	{
		res += ((T)1.0);
	}

	return res;
}